

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O3

void chirc_ctx_add_connection(chirc_ctx_t *ctx,chirc_connection_t *conn)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  UT_hash_table *pUVar6;
  UT_hash_bucket *__ptr;
  UT_hash_bucket *pUVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar8 = conn->socket + 0x112410dU ^ 0x7f76d;
  uVar9 = uVar8 << 8 ^ 0x9f49bac6 - uVar8;
  uVar11 = uVar9 >> 0xd ^ (-0x112410d - uVar8) - uVar9;
  uVar12 = uVar11 >> 0xc ^ (uVar8 - uVar9) - uVar11;
  uVar8 = uVar12 << 0x10 ^ (uVar9 - uVar11) - uVar12;
  uVar9 = uVar8 >> 5 ^ (uVar11 - uVar12) - uVar8;
  uVar11 = uVar9 >> 3 ^ (uVar12 - uVar8) - uVar9;
  uVar8 = uVar11 << 10 ^ (uVar8 - uVar9) - uVar11;
  uVar8 = uVar8 >> 0xf ^ uVar9 - (uVar11 + uVar8);
  pUVar1 = &conn->hh;
  (conn->hh).hashv = uVar8;
  (conn->hh).key = &conn->socket;
  (conn->hh).keylen = 4;
  if (ctx->connections == (chirc_connection_t *)0x0) {
    pUVar6 = (UT_hash_table *)calloc(1,0x40);
    (conn->hh).prev = (void *)0x0;
    (conn->hh).next = (void *)0x0;
    (conn->hh).tbl = pUVar6;
    if (pUVar6 == (UT_hash_table *)0x0) goto LAB_001036ee;
    pUVar6->tail = pUVar1;
    pUVar6->num_buckets = 0x20;
    pUVar6->log2_num_buckets = 5;
    pUVar6->hho = 0x28;
    __ptr = (UT_hash_bucket *)calloc(1,0x200);
    pUVar6->buckets = __ptr;
    pUVar6->signature = 0xa0111fe1;
    if (__ptr == (UT_hash_bucket *)0x0) goto LAB_001036ee;
    ctx->connections = conn;
    uVar9 = 0x20;
  }
  else {
    pUVar6 = (ctx->connections->hh).tbl;
    (conn->hh).tbl = pUVar6;
    (conn->hh).next = (void *)0x0;
    pUVar3 = pUVar6->tail;
    (conn->hh).prev = (void *)((long)pUVar3 - pUVar6->hho);
    pUVar3->next = conn;
    pUVar6->tail = pUVar1;
    uVar9 = pUVar6->num_buckets;
    __ptr = pUVar6->buckets;
  }
  uVar12 = pUVar6->num_items + 1;
  pUVar6->num_items = uVar12;
  uVar8 = uVar9 - 1 & uVar8;
  uVar11 = __ptr[uVar8].count + 1;
  __ptr[uVar8].count = uVar11;
  pUVar3 = __ptr[uVar8].hh_head;
  (conn->hh).hh_next = pUVar3;
  (conn->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar3 != (UT_hash_handle *)0x0) {
    pUVar3->hh_prev = pUVar1;
  }
  __ptr[uVar8].hh_head = pUVar1;
  if ((__ptr[uVar8].expand_mult * 10 + 10 <= uVar11) && (pUVar6->noexpand == 0)) {
    pUVar7 = (UT_hash_bucket *)calloc(1,(ulong)uVar9 << 5);
    if (pUVar7 == (UT_hash_bucket *)0x0) {
LAB_001036ee:
      exit(-1);
    }
    uVar8 = uVar9 * 2 - 1;
    uVar11 = ((uVar12 >> ((char)pUVar6->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar8 & uVar12) == 0);
    pUVar6->ideal_chain_maxlen = uVar11;
    pUVar6->nonideal_items = 0;
    if (uVar9 != 0) {
      uVar12 = 0;
      uVar10 = 0;
      do {
        pUVar3 = __ptr[uVar10].hh_head;
        while (pUVar3 != (UT_hash_handle *)0x0) {
          pUVar4 = pUVar3->hh_next;
          uVar14 = pUVar3->hashv & uVar8;
          pUVar2 = pUVar7 + uVar14;
          uVar13 = pUVar7[uVar14].count + 1;
          pUVar7[uVar14].count = uVar13;
          if (uVar11 < uVar13) {
            uVar12 = uVar12 + 1;
            pUVar6->nonideal_items = uVar12;
            if (pUVar2->expand_mult * uVar11 < uVar13) {
              pUVar2->expand_mult = pUVar2->expand_mult + 1;
            }
          }
          pUVar3->hh_prev = (UT_hash_handle *)0x0;
          pUVar5 = pUVar2->hh_head;
          pUVar3->hh_next = pUVar5;
          if (pUVar5 != (UT_hash_handle *)0x0) {
            pUVar5->hh_prev = pUVar3;
          }
          pUVar2->hh_head = pUVar3;
          pUVar3 = pUVar4;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
    }
    free(__ptr);
    pUVar6 = pUVar1->tbl;
    pUVar6->num_buckets = pUVar6->num_buckets << 1;
    pUVar6->log2_num_buckets = pUVar6->log2_num_buckets + 1;
    pUVar6->buckets = pUVar7;
    if (pUVar6->num_items >> 1 < pUVar6->nonideal_items) {
      uVar8 = pUVar6->ineff_expands + 1;
      pUVar6->ineff_expands = uVar8;
      if (1 < uVar8) {
        pUVar6->noexpand = 1;
      }
    }
    else {
      pUVar6->ineff_expands = 0;
    }
  }
  return;
}

Assistant:

void chirc_ctx_add_connection(chirc_ctx_t *ctx, chirc_connection_t *conn)
{
    HASH_ADD_INT(ctx->connections, socket, conn);
}